

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::compute_A_tile_int8_scales
               (Mat *A,Mat *scales,float B_scale,Mat *out_descales,int i,int max_ii)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  undefined1 (*pauVar13) [32];
  int iVar14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  __m128 _absmax1;
  
  iVar1 = A->elempack;
  iVar12 = A->w;
  if (A->dims == 3) {
    iVar12 = (int)A->cstep;
  }
  lVar9 = (long)i;
  pauVar13 = (undefined1 (*) [32])((long)scales->data + lVar9 * 4);
  pauVar15 = (undefined1 (*) [32])(lVar9 * 4 + (long)out_descales->data);
  uVar8 = (long)max_ii / (long)iVar1 & 0xffffffff;
  iVar14 = A->w * iVar1;
  auVar19 = ZEXT416((uint)((1.0 / B_scale) * 0.007874016));
  auVar19 = vshufps_avx(auVar19,auVar19,0);
  lVar10 = (long)iVar12;
  uVar16 = 0;
  if ((int)((long)max_ii / (long)iVar1) < 1) {
    uVar8 = 0;
  }
  lVar11 = lVar10 * lVar9 * 4;
  auVar20._8_4_ = 0x7fffffff;
  auVar20._0_8_ = 0x7fffffff7fffffff;
  auVar20._12_4_ = 0x7fffffff;
  auVar20._16_4_ = 0x7fffffff;
  auVar20._20_4_ = 0x7fffffff;
  auVar20._24_4_ = 0x7fffffff;
  auVar20._28_4_ = 0x7fffffff;
  auVar21._8_4_ = 0x7fffffff;
  auVar21._0_8_ = 0x7fffffff7fffffff;
  auVar21._12_4_ = 0x7fffffff;
  auVar22._8_4_ = 0x42fe0000;
  auVar22._0_8_ = 0x42fe000042fe0000;
  auVar22._12_4_ = 0x42fe0000;
  auVar23._8_4_ = 0x42fe0000;
  auVar23._0_8_ = 0x42fe000042fe0000;
  auVar23._12_4_ = 0x42fe0000;
  auVar23._16_4_ = 0x42fe0000;
  auVar23._20_4_ = 0x42fe0000;
  auVar23._24_4_ = 0x42fe0000;
  auVar23._28_4_ = 0x42fe0000;
  for (; uVar16 != uVar8; uVar16 = uVar16 + 1) {
    pauVar18 = (undefined1 (*) [32])((long)A->data + (uVar16 * (long)iVar1 + lVar9) * lVar10 * 4);
    auVar24 = ZEXT1664(ZEXT816(0) << 0x40);
    lVar17 = 0;
    for (iVar12 = 0; iVar12 + 7 < iVar14; iVar12 = iVar12 + 8) {
      auVar3 = vandps_avx(auVar20,*pauVar18);
      auVar3 = vmaxps_avx(auVar24._0_32_,auVar3);
      auVar24 = ZEXT3264(auVar3);
      pauVar18 = pauVar18 + 1;
      lVar17 = lVar17 + 8;
    }
    auVar26 = ZEXT816(0) << 0x40;
    for (; iVar12 + 3 < iVar14; iVar12 = iVar12 + 4) {
      auVar27 = vandps_avx(auVar21,*(undefined1 (*) [16])*pauVar18);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
      lVar17 = lVar17 + 4;
    }
    auVar27 = ZEXT816(0) << 0x40;
    for (; (int)lVar17 < iVar14; lVar17 = lVar17 + 1) {
      auVar2 = vandps_avx(ZEXT416(*(uint *)((long)A->data + lVar17 * 4 + lVar11)),auVar21);
      auVar27 = vmaxss_avx(auVar2,auVar27);
    }
    if (iVar1 == 1) {
      auVar2 = vmaxps_avx(auVar24._16_16_,auVar24._0_16_);
      auVar7 = vshufpd_avx(auVar2,auVar2,3);
      auVar2 = vmaxps_avx(auVar2,auVar7);
      auVar7 = vmovshdup_avx(auVar2);
      auVar2 = vmaxss_avx(auVar2,auVar7);
      auVar7 = vshufpd_avx(auVar26,auVar26,3);
      auVar26 = vmaxps_avx(auVar26,auVar7);
      auVar7 = vmovshdup_avx(auVar26);
      auVar26 = vmaxss_avx(auVar26,auVar7);
      auVar26 = vmaxss_avx(auVar26,auVar27);
      auVar26 = vmaxss_avx(auVar26,auVar2);
      *(float *)*pauVar13 = 127.0 / auVar26._0_4_;
      *(float *)*pauVar15 = auVar26._0_4_ * 0.007874016 * (1.0 / B_scale);
      pauVar13 = (undefined1 (*) [32])(*pauVar13 + 4);
      pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 4);
    }
    else {
      fVar4 = auVar19._0_4_;
      fVar5 = auVar19._4_4_;
      fVar6 = auVar19._8_4_;
      if (iVar1 == 4) {
        auVar26 = vmaxps_avx(auVar26,auVar24._0_16_);
        auVar27 = vmaxps_avx(auVar26,auVar24._16_16_);
        auVar26 = vdivps_avx(auVar22,auVar27);
        *(undefined1 (*) [16])*pauVar13 = auVar26;
        *(float *)*pauVar15 = auVar27._0_4_ * fVar4;
        *(float *)((long)*pauVar15 + 4) = auVar27._4_4_ * fVar5;
        *(float *)((long)*pauVar15 + 8) = auVar27._8_4_ * fVar6;
        *(float *)((long)*pauVar15 + 0xc) = auVar27._12_4_ * auVar19._12_4_;
        pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
        pauVar15 = (undefined1 (*) [32])((long)*pauVar15 + 0x10);
      }
      else if (iVar1 == 8) {
        auVar3 = vdivps_avx(auVar23,auVar24._0_32_);
        auVar25._0_4_ = auVar24._0_4_ * fVar4;
        auVar25._4_4_ = auVar24._4_4_ * fVar5;
        auVar25._8_4_ = auVar24._8_4_ * fVar6;
        auVar25._12_4_ = auVar24._12_4_ * auVar19._12_4_;
        auVar25._16_4_ = auVar24._16_4_ * fVar4;
        auVar25._20_4_ = auVar24._20_4_ * fVar5;
        auVar25._28_36_ = auVar24._28_36_;
        auVar25._24_4_ = auVar24._24_4_ * fVar6;
        *pauVar13 = auVar3;
        *pauVar15 = auVar25._0_32_;
        pauVar13 = pauVar13 + 1;
        pauVar15 = pauVar15 + 1;
      }
    }
    lVar11 = lVar11 + lVar10 * iVar1 * 4;
  }
  return;
}

Assistant:

static void compute_A_tile_int8_scales(const Mat& A, Mat& scales, float B_scale, Mat& out_descales, int i, int max_ii)
{
    compute_A_tile_fp32_int8_scales(A, scales, B_scale, out_descales, i, max_ii);
}